

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t JenkinsOOAT(char *key,int len,uint32_t hash)

{
  uint uVar1;
  uchar *seed;
  uint64_t s;
  uchar *end;
  uchar *str;
  uint32_t hash_local;
  int len_local;
  char *key_local;
  
  hash_local = hash;
  for (str = (uchar *)key; str < key + len; str = str + 1) {
    hash_local = (uint)*str + (hash_local * 0x401 >> 6 ^ hash_local * 0x401);
  }
  uVar1 = (hash_local * 0x401 >> 6 ^ hash_local * 0x401) * 0x401;
  uVar1 = (uVar1 >> 6 ^ uVar1) * 0x401;
  uVar1 = (uVar1 >> 6 ^ uVar1) * 0x401;
  uVar1 = (uVar1 >> 6 ^ uVar1) * 0x401;
  uVar1 = (uVar1 >> 6 ^ uVar1) * 9;
  return (uVar1 >> 0xb ^ uVar1) * 0x8001;
}

Assistant:

uint32_t
JenkinsOOAT(const char *key, int len, uint32_t hash)
{
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint64_t	  s = (uint64_t) hash;
  unsigned char  *seed = (unsigned char *)&s;
  //unsigned char seed[8];
  //note that perl5 adds the seed to the end of key, which looks like cargo cult
  while (str < end) {
    hash += (hash << 10);
    hash ^= (hash >> 6);
    hash += *str++;
  }

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[4];

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[5];

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[6];

  hash += (hash << 10);
  hash ^= (hash >> 6);
  hash += seed[7];

  hash += (hash << 10);
  hash ^= (hash >> 6);

  hash += (hash << 3);
  hash ^= (hash >> 11);
  hash = hash + (hash << 15);

  return hash;
}